

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

void SetWindowMonitor(int monitor)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  GLFWmonitor **ppGVar5;
  char *pcVar6;
  GLFWvidmode *pGVar7;
  int ypos;
  int xpos;
  int monitorWorkareaY;
  int monitorWorkareaX;
  int monitorWorkareaHeight;
  int monitorCount;
  int monitorWorkareaWidth;
  
  uVar1 = (ulong)(uint)monitor;
  monitorCount = 0;
  ppGVar5 = glfwGetMonitors(&monitorCount);
  _Var2 = CORE.Window.fullscreen;
  if ((monitor < 0) || (monitorCount <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
  }
  else {
    pcVar6 = glfwGetMonitorName(ppGVar5[uVar1]);
    if (_Var2 == true) {
      TraceLog(3,"GLFW: Selected fullscreen monitor: [%i] %s",uVar1);
      pGVar7 = glfwGetVideoMode(ppGVar5[uVar1]);
      glfwSetWindowMonitor
                (platform.handle,ppGVar5[uVar1],0,0,pGVar7->width,pGVar7->height,pGVar7->refreshRate
                );
    }
    else {
      TraceLog(3,"GLFW: Selected monitor: [%i] %s",uVar1,pcVar6);
      uVar4 = CORE.Window.render.height;
      uVar3 = CORE.Window.render.width;
      monitorWorkareaX = 0;
      monitorWorkareaY = 0;
      monitorWorkareaWidth = 0;
      monitorWorkareaHeight = 0;
      glfwGetMonitorWorkarea
                (ppGVar5[uVar1],&monitorWorkareaX,&monitorWorkareaY,&monitorWorkareaWidth,
                 &monitorWorkareaHeight);
      xpos = monitorWorkareaX;
      ypos = monitorWorkareaY;
      if (((int)uVar3 < monitorWorkareaWidth) && ((int)uVar4 < monitorWorkareaHeight)) {
        xpos = monitorWorkareaWidth / 2 + (int)uVar3 / -2 + monitorWorkareaX;
        ypos = monitorWorkareaHeight / 2 + (int)uVar4 / -2 + monitorWorkareaY;
      }
      glfwSetWindowPos(platform.handle,xpos,ypos);
    }
  }
  return;
}

Assistant:

void SetWindowMonitor(int monitor)
{
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount))
    {
        if (CORE.Window.fullscreen)
        {
            TRACELOG(LOG_INFO, "GLFW: Selected fullscreen monitor: [%i] %s", monitor, glfwGetMonitorName(monitors[monitor]));

            const GLFWvidmode *mode = glfwGetVideoMode(monitors[monitor]);
            glfwSetWindowMonitor(platform.handle, monitors[monitor], 0, 0, mode->width, mode->height, mode->refreshRate);
        }
        else
        {
            TRACELOG(LOG_INFO, "GLFW: Selected monitor: [%i] %s", monitor, glfwGetMonitorName(monitors[monitor]));

            // Here the render width has to be used again in case high dpi flag is enabled
            const int screenWidth = CORE.Window.render.width;
            const int screenHeight = CORE.Window.render.height;
            int monitorWorkareaX = 0;
            int monitorWorkareaY = 0;
            int monitorWorkareaWidth = 0;
            int monitorWorkareaHeight = 0;
            glfwGetMonitorWorkarea(monitors[monitor], &monitorWorkareaX, &monitorWorkareaY, &monitorWorkareaWidth, &monitorWorkareaHeight);

            // If the screen size is larger than the monitor workarea, anchor it on the top left corner, otherwise, center it
            if ((screenWidth >= monitorWorkareaWidth) || (screenHeight >= monitorWorkareaHeight)) glfwSetWindowPos(platform.handle, monitorWorkareaX, monitorWorkareaY);
            else
            {
                const int x = monitorWorkareaX + (monitorWorkareaWidth/2) - (screenWidth/2);
                const int y = monitorWorkareaY + (monitorWorkareaHeight/2) - (screenHeight/2);
                glfwSetWindowPos(platform.handle, x, y);
            }
        }
    }
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");
}